

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O3

bool __thiscall iutest::floating_point<float>::AlmostEquals(floating_point<float> *this,_Myt *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (this->m_v).iv;
  if (((~uVar1 & 0x7f800000) != 0 || (uVar1 & 0x7fffff) == 0) &&
     (uVar3 = (rhs->m_v).iv, (~uVar3 & 0x7f800000) != 0 || (uVar3 & 0x7fffff) == 0)) {
    uVar2 = uVar1 | 0x80000000;
    if ((int)uVar1 < 0) {
      uVar2 = -uVar1;
    }
    uVar1 = uVar3 | 0x80000000;
    if ((int)uVar3 < 0) {
      uVar1 = -uVar3;
    }
    uVar3 = uVar1 - uVar2;
    if (uVar1 < uVar2) {
      uVar3 = -(uVar1 - uVar2);
    }
    return uVar3 < 5;
  }
  return false;
}

Assistant:

UInt    exponent_bits() const { return m_v.uv & kExpMask; }